

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O3

int __thiscall
deqp::gls::BufferTestUtil::BufferMapVerifier::verify
          (BufferMapVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLenum GVar2;
  deUint8 *resPtr;
  undefined7 extraout_var;
  TestError *this_01;
  GLenum target;
  
  target = (GLenum)tbslen;
  this_00 = &(this->super_BufferVerifierBase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,target,(GLuint)ctx);
  resPtr = (deUint8 *)
           glu::CallLogWrapper::glMapBufferRange(this_00,target,(long)(int)siglen,(long)(int)tbs,1);
  GVar2 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar2,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
                  ,0x192);
  if (resPtr != (deUint8 *)0x0) {
    bVar1 = compareByteArrays((this->super_BufferVerifierBase).m_log,resPtr,sig + (int)siglen,
                              (int)tbs);
    glu::CallLogWrapper::glUnmapBuffer(this_00,target);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar2,"glUnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
                    ,0x198);
    glu::CallLogWrapper::glBindBuffer(this_00,target,0);
    return (int)CONCAT71(extraout_var,bVar1);
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"mapPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
             ,0x193);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool BufferMapVerifier::verify (deUint32 buffer, const deUint8* reference, int offset, int numBytes, deUint32 target)
{
	const deUint8*	mapPtr		= DE_NULL;
	bool			isOk		= false;

	glBindBuffer(target, buffer);
	mapPtr = (const deUint8*)glMapBufferRange(target, offset, numBytes, GL_MAP_READ_BIT);
	GLU_CHECK_MSG("glMapBufferRange");
	TCU_CHECK(mapPtr);

	isOk = compareByteArrays(m_log, mapPtr, reference+offset, numBytes);

	glUnmapBuffer(target);
	GLU_CHECK_MSG("glUnmapBuffer");

	glBindBuffer(target, 0);

	return isOk;
}